

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::InstanceIntersectorK<4>_>,_false>
     ::intersectCoherent(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,
                        RayQueryContext *context)

{
  float fVar1;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar5;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar6;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar7;
  uint uVar8;
  AccelData *pAVar9;
  byte bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined8 uVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  size_t sVar22;
  size_t sVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  size_t sVar28;
  Primitive *prim;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar29;
  ulong uVar30;
  byte bVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  vint4 ai;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  vint4 ai_1;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  vint4 bi;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  vint4 bi_1;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  vint4 bi_2;
  undefined1 auVar82 [16];
  undefined4 uVar83;
  vint4 bi_4;
  undefined1 auVar84 [16];
  vint4 ai_2;
  vint4 bi_3;
  undefined1 auVar85 [16];
  int in_XMM11_Da;
  int in_XMM11_Db;
  int in_XMM11_Dc;
  int in_XMM11_Dd;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar90 [64];
  vint<4> octant;
  Precalculations pre;
  vbool<4>_conflict valid_leaf;
  uint uStack_1190;
  undefined1 auStack_1197 [15];
  uint local_1018 [4];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  uint local_f98;
  uint uStack_f94;
  uint uStack_f90;
  uint uStack_f8c;
  vfloat<4> fmin;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar41 [16];
  undefined1 auVar46 [16];
  undefined1 auVar50 [16];
  undefined1 auVar72 [64];
  
  auVar38 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  uVar32 = vpcmpeqd_avx512vl(auVar38,(undefined1  [16])valid_i->field_0);
  uVar32 = uVar32 & 0xf;
  if ((byte)uVar32 != 0) {
    pAVar9 = This->ptr;
    auVar37 = *(undefined1 (*) [16])(ray + 0x40);
    auVar52._8_4_ = 0x7fffffff;
    auVar52._0_8_ = 0x7fffffff7fffffff;
    auVar52._12_4_ = 0x7fffffff;
    auVar18 = vandps_avx(auVar37,auVar52);
    auVar58._8_4_ = 0x219392ef;
    auVar58._0_8_ = 0x219392ef219392ef;
    auVar58._12_4_ = 0x219392ef;
    uVar30 = vcmpps_avx512vl(auVar18,auVar58,1);
    auVar18 = *(undefined1 (*) [16])(ray + 0x50);
    auVar34 = vblendmps_avx512vl(auVar37,auVar58);
    bVar11 = (bool)((byte)uVar30 & 1);
    auVar35._0_4_ = (uint)bVar11 * auVar34._0_4_ | (uint)!bVar11 * in_XMM11_Da;
    bVar11 = (bool)((byte)(uVar30 >> 1) & 1);
    auVar35._4_4_ = (uint)bVar11 * auVar34._4_4_ | (uint)!bVar11 * in_XMM11_Db;
    bVar11 = (bool)((byte)(uVar30 >> 2) & 1);
    auVar35._8_4_ = (uint)bVar11 * auVar34._8_4_ | (uint)!bVar11 * in_XMM11_Dc;
    bVar11 = (bool)((byte)(uVar30 >> 3) & 1);
    auVar35._12_4_ = (uint)bVar11 * auVar34._12_4_ | (uint)!bVar11 * in_XMM11_Dd;
    auVar34 = vandps_avx(auVar18,auVar52);
    uVar30 = vcmpps_avx512vl(auVar34,auVar58,1);
    bVar11 = (bool)((byte)uVar30 & 1);
    auVar40._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar18._0_4_;
    bVar11 = (bool)((byte)(uVar30 >> 1) & 1);
    auVar40._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar18._4_4_;
    bVar11 = (bool)((byte)(uVar30 >> 2) & 1);
    auVar40._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar18._8_4_;
    bVar11 = (bool)((byte)(uVar30 >> 3) & 1);
    auVar40._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar18._12_4_;
    auVar18 = *(undefined1 (*) [16])(ray + 0x60);
    auVar34 = vandps_avx(auVar18,auVar52);
    uVar30 = vcmpps_avx512vl(auVar34,auVar58,1);
    bVar11 = (bool)((byte)uVar30 & 1);
    auVar45._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar18._0_4_;
    bVar11 = (bool)((byte)(uVar30 >> 1) & 1);
    auVar45._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar18._4_4_;
    bVar11 = (bool)((byte)(uVar30 >> 2) & 1);
    auVar45._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar18._8_4_;
    bVar11 = (bool)((byte)(uVar30 >> 3) & 1);
    auVar45._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar18._12_4_;
    auVar34 = vrcp14ps_avx512vl(auVar35);
    auVar54._8_4_ = 0x3f800000;
    auVar54._0_8_ = &DAT_3f8000003f800000;
    auVar54._12_4_ = 0x3f800000;
    auVar52 = ZEXT816(0) << 0x40;
    auVar18 = vfnmadd213ps_fma(auVar35,auVar34,auVar54);
    auVar18 = vfmadd132ps_fma(auVar18,auVar34,auVar34);
    auVar35 = vrcp14ps_avx512vl(auVar40);
    auVar34 = vfnmadd213ps_fma(auVar40,auVar35,auVar54);
    auVar34 = vfmadd132ps_fma(auVar34,auVar35,auVar35);
    auVar36 = vrcp14ps_avx512vl(auVar45);
    auVar35 = vfnmadd213ps_fma(auVar45,auVar36,auVar54);
    auVar35 = vfmadd132ps_fma(auVar35,auVar36,auVar36);
    auVar37 = vcmpps_avx(auVar37,auVar52,1);
    auVar36._8_4_ = 1;
    auVar36._0_8_ = 0x100000001;
    auVar36._12_4_ = 1;
    auVar36 = vandps_avx512vl(auVar37,auVar36);
    uVar30 = vcmpps_avx512vl(auVar52,*(undefined1 (*) [16])(ray + 0x50),0xe);
    auVar59._8_4_ = 2;
    auVar59._0_8_ = 0x200000002;
    auVar59._12_4_ = 2;
    local_ff8 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar52);
    auVar37 = vpsubd_avx512vl(auVar59,auVar37);
    bVar11 = (bool)((byte)uVar30 & 1);
    auVar49._0_4_ = (uint)bVar11 * auVar37._0_4_ | (uint)!bVar11 * auVar36._0_4_;
    bVar11 = (bool)((byte)(uVar30 >> 1) & 1);
    auVar49._4_4_ = (uint)bVar11 * auVar37._4_4_ | (uint)!bVar11 * auVar36._4_4_;
    bVar11 = (bool)((byte)(uVar30 >> 2) & 1);
    auVar49._8_4_ = (uint)bVar11 * auVar37._8_4_ | (uint)!bVar11 * auVar36._8_4_;
    bVar11 = (bool)((byte)(uVar30 >> 3) & 1);
    auVar49._12_4_ = (uint)bVar11 * auVar37._12_4_ | (uint)!bVar11 * auVar36._12_4_;
    uVar30 = vcmpps_avx512vl(auVar52,*(undefined1 (*) [16])(ray + 0x60),0xe);
    auVar37._8_4_ = 4;
    auVar37._0_8_ = 0x400000004;
    auVar37._12_4_ = 4;
    auVar37 = vpord_avx512vl(auVar49,auVar37);
    bVar11 = (bool)((byte)uVar30 & 1);
    auVar56._0_4_ = (uint)bVar11 * auVar37._0_4_ | !bVar11 * auVar49._0_4_;
    bVar11 = (bool)((byte)(uVar30 >> 1) & 1);
    auVar56._4_4_ = (uint)bVar11 * auVar37._4_4_ | !bVar11 * auVar49._4_4_;
    bVar11 = (bool)((byte)(uVar30 >> 2) & 1);
    auVar56._8_4_ = (uint)bVar11 * auVar37._8_4_ | !bVar11 * auVar49._8_4_;
    bVar11 = (bool)((byte)(uVar30 >> 3) & 1);
    auVar56._12_4_ = (uint)bVar11 * auVar37._12_4_ | !bVar11 * auVar49._12_4_;
    local_1008 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar52);
    auVar37 = vmovdqa32_avx512vl(auVar56);
    bVar11 = (bool)((byte)uVar32 & 1);
    bVar12 = (bool)((byte)(uVar32 >> 1) & 1);
    bVar13 = (bool)((byte)(uVar32 >> 2) & 1);
    bVar15 = SUB81(uVar32 >> 3,0);
    local_1018[0] = (uint)bVar11 * auVar37._0_4_ | (uint)!bVar11 * auVar38._0_4_;
    local_1018[1] = (uint)bVar12 * auVar37._4_4_ | (uint)!bVar12 * auVar38._4_4_;
    local_1018[2] = (uint)bVar13 * auVar37._8_4_ | (uint)!bVar13 * auVar38._8_4_;
    local_1018[3] = (uint)bVar15 * auVar37._12_4_ | (uint)!bVar15 * auVar38._12_4_;
    local_fc8 = *(float *)ray;
    fStack_fc4 = *(float *)(ray + 4);
    fStack_fc0 = *(float *)(ray + 8);
    fStack_fbc = *(float *)(ray + 0xc);
    auVar86._0_4_ = auVar18._0_4_ * -*(float *)ray;
    auVar86._4_4_ = auVar18._4_4_ * -*(float *)(ray + 4);
    auVar86._8_4_ = auVar18._8_4_ * -*(float *)(ray + 8);
    auVar86._12_4_ = auVar18._12_4_ * -*(float *)(ray + 0xc);
    local_fd8 = *(float *)(ray + 0x10);
    fStack_fd4 = *(float *)(ray + 0x14);
    fStack_fd0 = *(float *)(ray + 0x18);
    fStack_fcc = *(float *)(ray + 0x1c);
    auVar87._0_4_ = auVar34._0_4_ * -*(float *)(ray + 0x10);
    auVar87._4_4_ = auVar34._4_4_ * -*(float *)(ray + 0x14);
    auVar87._8_4_ = auVar34._8_4_ * -*(float *)(ray + 0x18);
    auVar87._12_4_ = auVar34._12_4_ * -*(float *)(ray + 0x1c);
    local_fe8 = *(float *)(ray + 0x20);
    fStack_fe4 = *(float *)(ray + 0x24);
    fStack_fe0 = *(float *)(ray + 0x28);
    fStack_fdc = *(float *)(ray + 0x2c);
    auVar88._0_4_ = auVar35._0_4_ * -*(float *)(ray + 0x20);
    auVar88._4_4_ = auVar35._4_4_ * -*(float *)(ray + 0x24);
    auVar88._8_4_ = auVar35._8_4_ * -*(float *)(ray + 0x28);
    auVar88._12_4_ = auVar35._12_4_ * -*(float *)(ray + 0x2c);
    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
    auVar89 = ZEXT1664(auVar38);
    do {
      lVar24 = 0;
      for (uVar30 = uVar32; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      uVar8 = local_1018[lVar24];
      auVar67._4_4_ = uVar8;
      auVar67._0_4_ = uVar8;
      auVar67._8_4_ = uVar8;
      auVar67._12_4_ = uVar8;
      auVar38._4_4_ = local_1018[1];
      auVar38._0_4_ = local_1018[0];
      auVar38._8_4_ = local_1018[2];
      auVar38._12_4_ = local_1018[3];
      uVar33 = vpcmpeqd_avx512vl(auVar67,auVar38);
      uVar33 = uVar33 & 0xf;
      bVar31 = (byte)uVar33;
      uVar32 = (long)(char)~bVar31 & uVar32;
      auVar58 = auVar89._0_16_;
      auVar38 = vblendmps_avx512vl(auVar58,auVar18);
      auVar66._0_4_ = (uint)(bVar31 & 1) * auVar38._0_4_ | !(bool)(bVar31 & 1) * uVar8;
      bVar11 = (bool)((byte)(uVar33 >> 1) & 1);
      auVar66._4_4_ = (uint)bVar11 * auVar38._4_4_ | !bVar11 * uVar8;
      bVar11 = (bool)((byte)(uVar33 >> 2) & 1);
      auVar66._8_4_ = (uint)bVar11 * auVar38._8_4_ | !bVar11 * uVar8;
      bVar11 = SUB81(uVar33 >> 3,0);
      auVar66._12_4_ = (uint)bVar11 * auVar38._12_4_ | !bVar11 * uVar8;
      auVar38 = vshufps_avx(auVar66,auVar66,0xb1);
      auVar38 = vminps_avx(auVar38,auVar66);
      auVar37 = vshufpd_avx(auVar38,auVar38,1);
      auVar38 = vminps_avx(auVar37,auVar38);
      auVar36 = vblendmps_avx512vl(auVar58,auVar34);
      auVar63._0_4_ = (uint)(bVar31 & 1) * auVar36._0_4_ | (uint)!(bool)(bVar31 & 1) * auVar37._0_4_
      ;
      bVar11 = (bool)((byte)(uVar33 >> 1) & 1);
      auVar63._4_4_ = (uint)bVar11 * auVar36._4_4_ | (uint)!bVar11 * auVar37._4_4_;
      bVar11 = (bool)((byte)(uVar33 >> 2) & 1);
      auVar63._8_4_ = (uint)bVar11 * auVar36._8_4_ | (uint)!bVar11 * auVar37._8_4_;
      bVar11 = SUB81(uVar33 >> 3,0);
      auVar63._12_4_ = (uint)bVar11 * auVar36._12_4_ | (uint)!bVar11 * auVar37._12_4_;
      auVar37 = vshufps_avx(auVar63,auVar63,0xb1);
      auVar37 = vminps_avx(auVar37,auVar63);
      auVar36 = vshufpd_avx(auVar37,auVar37,1);
      auVar37 = vminps_avx(auVar36,auVar37);
      auVar38 = vinsertps_avx(auVar38,auVar37,0x1c);
      auVar36 = vblendmps_avx512vl(auVar58,auVar35);
      auVar64._0_4_ = (uint)(bVar31 & 1) * auVar36._0_4_ | (uint)!(bool)(bVar31 & 1) * auVar37._0_4_
      ;
      bVar11 = (bool)((byte)(uVar33 >> 1) & 1);
      auVar64._4_4_ = (uint)bVar11 * auVar36._4_4_ | (uint)!bVar11 * auVar37._4_4_;
      bVar11 = (bool)((byte)(uVar33 >> 2) & 1);
      auVar64._8_4_ = (uint)bVar11 * auVar36._8_4_ | (uint)!bVar11 * auVar37._8_4_;
      bVar11 = SUB81(uVar33 >> 3,0);
      auVar64._12_4_ = (uint)bVar11 * auVar36._12_4_ | (uint)!bVar11 * auVar37._12_4_;
      auVar37 = vshufps_avx(auVar64,auVar64,0xb1);
      auVar37 = vminps_avx(auVar37,auVar64);
      auVar36 = vshufpd_avx(auVar37,auVar37,1);
      auVar37 = vminps_avx(auVar36,auVar37);
      auVar38 = vinsertps_avx(auVar38,auVar37,0x20);
      auVar85._8_4_ = 0xff800000;
      auVar85._0_8_ = 0xff800000ff800000;
      auVar85._12_4_ = 0xff800000;
      auVar36 = vblendmps_avx512vl(auVar85,auVar18);
      auVar39._0_4_ = (uint)(bVar31 & 1) * auVar36._0_4_ | (uint)!(bool)(bVar31 & 1) * auVar37._0_4_
      ;
      bVar11 = (bool)((byte)(uVar33 >> 1) & 1);
      auVar39._4_4_ = (uint)bVar11 * auVar36._4_4_ | (uint)!bVar11 * auVar37._4_4_;
      bVar11 = (bool)((byte)(uVar33 >> 2) & 1);
      auVar39._8_4_ = (uint)bVar11 * auVar36._8_4_ | (uint)!bVar11 * auVar37._8_4_;
      bVar11 = SUB81(uVar33 >> 3,0);
      auVar39._12_4_ = (uint)bVar11 * auVar36._12_4_ | (uint)!bVar11 * auVar37._12_4_;
      auVar37 = vshufps_avx(auVar39,auVar39,0xb1);
      auVar37 = vmaxps_avx(auVar37,auVar39);
      auVar36 = vshufpd_avx(auVar37,auVar37,1);
      auVar37 = vmaxps_avx(auVar36,auVar37);
      auVar40 = vblendmps_avx512vl(auVar85,auVar34);
      auVar41._0_4_ = (uint)(bVar31 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar31 & 1) * auVar36._0_4_
      ;
      bVar11 = (bool)((byte)(uVar33 >> 1) & 1);
      auVar41._4_4_ = (uint)bVar11 * auVar40._4_4_ | (uint)!bVar11 * auVar36._4_4_;
      bVar11 = (bool)((byte)(uVar33 >> 2) & 1);
      auVar41._8_4_ = (uint)bVar11 * auVar40._8_4_ | (uint)!bVar11 * auVar36._8_4_;
      bVar11 = SUB81(uVar33 >> 3,0);
      auVar41._12_4_ = (uint)bVar11 * auVar40._12_4_ | (uint)!bVar11 * auVar36._12_4_;
      auVar36 = vshufps_avx(auVar41,auVar41,0xb1);
      auVar36 = vmaxps_avx(auVar36,auVar41);
      auVar40 = vshufpd_avx(auVar36,auVar36,1);
      auVar36 = vmaxps_avx(auVar40,auVar36);
      auVar37 = vinsertps_avx(auVar37,auVar36,0x1c);
      auVar40 = vblendmps_avx512vl(auVar85,auVar35);
      auVar42._0_4_ = (uint)(bVar31 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar31 & 1) * auVar36._0_4_
      ;
      bVar11 = (bool)((byte)(uVar33 >> 1) & 1);
      auVar42._4_4_ = (uint)bVar11 * auVar40._4_4_ | (uint)!bVar11 * auVar36._4_4_;
      bVar11 = (bool)((byte)(uVar33 >> 2) & 1);
      auVar42._8_4_ = (uint)bVar11 * auVar40._8_4_ | (uint)!bVar11 * auVar36._8_4_;
      bVar11 = SUB81(uVar33 >> 3,0);
      auVar42._12_4_ = (uint)bVar11 * auVar40._12_4_ | (uint)!bVar11 * auVar36._12_4_;
      auVar36 = vshufps_avx(auVar42,auVar42,0xb1);
      auVar36 = vmaxps_avx(auVar36,auVar42);
      auVar40 = vshufpd_avx(auVar36,auVar36,1);
      auVar36 = vmaxps_avx(auVar40,auVar36);
      auVar37 = vinsertps_avx(auVar37,auVar36,0x20);
      uVar30 = vcmpps_avx512vl(auVar38,ZEXT816(0) << 0x20,5);
      auVar36 = vblendmps_avx512vl(auVar37,auVar38);
      bVar10 = (byte)uVar30;
      fVar1 = (float)((uint)(bVar10 & 1) * auVar36._0_4_);
      fVar2 = (float)((uint)((byte)(uVar30 >> 1) & 1) * auVar36._4_4_);
      auVar43._4_4_ = fVar2;
      auVar43._0_4_ = fVar1;
      fVar3 = (float)((uint)((byte)(uVar30 >> 2) & 1) * auVar36._8_4_);
      auVar43._8_4_ = fVar3;
      fVar4 = (float)((uint)((byte)(uVar30 >> 3) & 1) * auVar36._12_4_);
      auVar43._12_4_ = fVar4;
      auVar36 = vmovshdup_avx(auVar43);
      uVar27 = (ulong)(auVar36._0_4_ < 0.0) << 4 | 0x20;
      auVar36 = vshufpd_avx(auVar43,auVar43,1);
      uVar25 = (ulong)(auVar36._0_4_ < 0.0) << 4 | 0x40;
      auVar62._4_4_ = fStack_fc4;
      auVar62._0_4_ = local_fc8;
      auVar62._8_4_ = fStack_fc0;
      auVar62._12_4_ = fStack_fbc;
      auVar40 = vblendmps_avx512vl(auVar58,auVar62);
      auVar44._0_4_ =
           (uint)(bVar31 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar31 & 1) * (int)auVar36._0_4_;
      bVar11 = (bool)((byte)(uVar33 >> 1) & 1);
      auVar44._4_4_ = (uint)bVar11 * auVar40._4_4_ | (uint)!bVar11 * auVar36._4_4_;
      bVar11 = (bool)((byte)(uVar33 >> 2) & 1);
      auVar44._8_4_ = (uint)bVar11 * auVar40._8_4_ | (uint)!bVar11 * auVar36._8_4_;
      bVar11 = SUB81(uVar33 >> 3,0);
      auVar44._12_4_ = (uint)bVar11 * auVar40._12_4_ | (uint)!bVar11 * auVar36._12_4_;
      auVar36 = vshufps_avx(auVar44,auVar44,0xb1);
      auVar36 = vminps_avx(auVar36,auVar44);
      auVar40 = vshufpd_avx(auVar36,auVar36,1);
      auVar36 = vminps_avx(auVar40,auVar36);
      auVar61._4_4_ = fStack_fd4;
      auVar61._0_4_ = local_fd8;
      auVar61._8_4_ = fStack_fd0;
      auVar61._12_4_ = fStack_fcc;
      auVar45 = vblendmps_avx512vl(auVar58,auVar61);
      auVar46._0_4_ = (uint)(bVar31 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar31 & 1) * auVar40._0_4_
      ;
      bVar11 = (bool)((byte)(uVar33 >> 1) & 1);
      auVar46._4_4_ = (uint)bVar11 * auVar45._4_4_ | (uint)!bVar11 * auVar40._4_4_;
      bVar11 = (bool)((byte)(uVar33 >> 2) & 1);
      auVar46._8_4_ = (uint)bVar11 * auVar45._8_4_ | (uint)!bVar11 * auVar40._8_4_;
      bVar11 = SUB81(uVar33 >> 3,0);
      auVar46._12_4_ = (uint)bVar11 * auVar45._12_4_ | (uint)!bVar11 * auVar40._12_4_;
      auVar40 = vshufps_avx(auVar46,auVar46,0xb1);
      auVar40 = vminps_avx(auVar40,auVar46);
      auVar45 = vshufpd_avx(auVar40,auVar40,1);
      auVar40 = vminps_avx(auVar45,auVar40);
      auVar36 = vinsertps_avx(auVar36,auVar40,0x1c);
      auVar60._4_4_ = fStack_fe4;
      auVar60._0_4_ = local_fe8;
      auVar60._8_4_ = fStack_fe0;
      auVar60._12_4_ = fStack_fdc;
      auVar45 = vblendmps_avx512vl(auVar58,auVar60);
      auVar47._0_4_ = (uint)(bVar31 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar31 & 1) * auVar40._0_4_
      ;
      bVar11 = (bool)((byte)(uVar33 >> 1) & 1);
      auVar47._4_4_ = (uint)bVar11 * auVar45._4_4_ | (uint)!bVar11 * auVar40._4_4_;
      bVar11 = (bool)((byte)(uVar33 >> 2) & 1);
      auVar47._8_4_ = (uint)bVar11 * auVar45._8_4_ | (uint)!bVar11 * auVar40._8_4_;
      bVar11 = SUB81(uVar33 >> 3,0);
      auVar47._12_4_ = (uint)bVar11 * auVar45._12_4_ | (uint)!bVar11 * auVar40._12_4_;
      auVar40 = vshufps_avx(auVar47,auVar47,0xb1);
      auVar40 = vminps_avx(auVar40,auVar47);
      auVar45 = vshufpd_avx(auVar40,auVar40,1);
      auVar40 = vminps_avx(auVar45,auVar40);
      auVar36 = vinsertps_avx(auVar36,auVar40,0x20);
      auVar45 = vblendmps_avx512vl(auVar85,auVar62);
      auVar48._0_4_ = (uint)(bVar31 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar31 & 1) * auVar40._0_4_
      ;
      bVar11 = (bool)((byte)(uVar33 >> 1) & 1);
      auVar48._4_4_ = (uint)bVar11 * auVar45._4_4_ | (uint)!bVar11 * auVar40._4_4_;
      bVar11 = (bool)((byte)(uVar33 >> 2) & 1);
      auVar48._8_4_ = (uint)bVar11 * auVar45._8_4_ | (uint)!bVar11 * auVar40._8_4_;
      bVar11 = SUB81(uVar33 >> 3,0);
      auVar48._12_4_ = (uint)bVar11 * auVar45._12_4_ | (uint)!bVar11 * auVar40._12_4_;
      auVar40 = vshufps_avx(auVar48,auVar48,0xb1);
      auVar40 = vmaxps_avx(auVar40,auVar48);
      auVar45 = vshufpd_avx(auVar40,auVar40,1);
      auVar40 = vmaxps_avx(auVar45,auVar40);
      auVar49 = vblendmps_avx512vl(auVar85,auVar61);
      auVar50._0_4_ = (uint)(bVar31 & 1) * auVar49._0_4_ | (uint)!(bool)(bVar31 & 1) * auVar45._0_4_
      ;
      bVar11 = (bool)((byte)(uVar33 >> 1) & 1);
      auVar50._4_4_ = (uint)bVar11 * auVar49._4_4_ | (uint)!bVar11 * auVar45._4_4_;
      bVar11 = (bool)((byte)(uVar33 >> 2) & 1);
      auVar50._8_4_ = (uint)bVar11 * auVar49._8_4_ | (uint)!bVar11 * auVar45._8_4_;
      bVar11 = SUB81(uVar33 >> 3,0);
      auVar50._12_4_ = (uint)bVar11 * auVar49._12_4_ | (uint)!bVar11 * auVar45._12_4_;
      auVar45 = vshufps_avx(auVar50,auVar50,0xb1);
      auVar45 = vmaxps_avx(auVar45,auVar50);
      auVar49 = vshufpd_avx(auVar45,auVar45,1);
      auVar45 = vmaxps_avx(auVar49,auVar45);
      auVar40 = vinsertps_avx(auVar40,auVar45,0x1c);
      auVar49 = vblendmps_avx512vl(auVar85,auVar60);
      auVar51._0_4_ = (uint)(bVar31 & 1) * auVar49._0_4_ | (uint)!(bool)(bVar31 & 1) * auVar45._0_4_
      ;
      bVar11 = (bool)((byte)(uVar33 >> 1) & 1);
      auVar51._4_4_ = (uint)bVar11 * auVar49._4_4_ | (uint)!bVar11 * auVar45._4_4_;
      bVar11 = (bool)((byte)(uVar33 >> 2) & 1);
      auVar51._8_4_ = (uint)bVar11 * auVar49._8_4_ | (uint)!bVar11 * auVar45._8_4_;
      bVar11 = SUB81(uVar33 >> 3,0);
      auVar51._12_4_ = (uint)bVar11 * auVar49._12_4_ | (uint)!bVar11 * auVar45._12_4_;
      auVar45 = vshufps_avx(auVar51,auVar51,0xb1);
      auVar45 = vmaxps_avx(auVar45,auVar51);
      auVar49 = vshufpd_avx(auVar45,auVar45,1);
      auVar45 = vmaxps_avx(auVar49,auVar45);
      auVar40 = vinsertps_avx(auVar40,auVar45,0x20);
      auVar52 = vblendmps_avx512vl(auVar40,auVar36);
      bVar11 = (bool)((byte)(uVar30 >> 1) & 1);
      bVar15 = (bool)((byte)(uVar30 >> 2) & 1);
      bVar16 = (bool)((byte)(uVar30 >> 3) & 1);
      bVar12 = (bool)((byte)(uVar30 >> 1) & 1);
      bVar14 = (bool)((byte)(uVar30 >> 2) & 1);
      bVar17 = (bool)((byte)(uVar30 >> 3) & 1);
      auVar49 = vblendmps_avx512vl(auVar85,local_1008);
      auVar53._0_4_ =
           (uint)(bVar31 & 1) * auVar49._0_4_ | (uint)!(bool)(bVar31 & 1) * in_ZMM17._0_4_;
      bVar13 = (bool)((byte)(uVar33 >> 1) & 1);
      auVar53._4_4_ = (uint)bVar13 * auVar49._4_4_ | (uint)!bVar13 * in_ZMM17._4_4_;
      bVar13 = (bool)((byte)(uVar33 >> 2) & 1);
      auVar53._8_4_ = (uint)bVar13 * auVar49._8_4_ | (uint)!bVar13 * in_ZMM17._8_4_;
      bVar13 = SUB81(uVar33 >> 3,0);
      auVar53._12_4_ = (uint)bVar13 * auVar49._12_4_ | (uint)!bVar13 * in_ZMM17._12_4_;
      in_ZMM17 = ZEXT1664(auVar53);
      auVar49 = vshufps_avx512vl(auVar53,auVar53,0xb1);
      auVar54 = vmaxps_avx512vl(auVar49,auVar53);
      auVar56 = vshufpd_avx(auVar54,auVar54,1);
      auVar49 = vblendmps_avx512vl(auVar58,local_ff8);
      auVar55._0_4_ =
           (uint)(bVar31 & 1) * auVar49._0_4_ | (uint)!(bool)(bVar31 & 1) * (int)local_fd8;
      bVar13 = (bool)((byte)(uVar33 >> 1) & 1);
      auVar55._4_4_ = (uint)bVar13 * auVar49._4_4_ | (uint)!bVar13 * (int)fStack_fd4;
      bVar13 = (bool)((byte)(uVar33 >> 2) & 1);
      auVar55._8_4_ = (uint)bVar13 * auVar49._8_4_ | (uint)!bVar13 * (int)fStack_fd0;
      bVar13 = SUB81(uVar33 >> 3,0);
      auVar55._12_4_ = (uint)bVar13 * auVar49._12_4_ | (uint)!bVar13 * (int)fStack_fcc;
      auVar49 = vshufps_avx(auVar55,auVar55,0xb1);
      auVar49 = vminps_avx(auVar49,auVar55);
      auVar56 = vmaxss_avx512f(auVar56,auVar54);
      auVar90 = ZEXT1664(auVar56);
      auVar57._0_4_ =
           (float)((uint)(bVar10 & 1) * auVar37._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar38._0_4_);
      bVar13 = (bool)((byte)(uVar30 >> 1) & 1);
      auVar57._4_4_ = (float)((uint)bVar13 * auVar37._4_4_ | (uint)!bVar13 * auVar38._4_4_);
      bVar13 = (bool)((byte)(uVar30 >> 2) & 1);
      auVar57._8_4_ = (float)((uint)bVar13 * auVar37._8_4_ | (uint)!bVar13 * auVar38._8_4_);
      bVar13 = (bool)((byte)(uVar30 >> 3) & 1);
      auVar57._12_4_ = (float)((uint)bVar13 * auVar37._12_4_ | (uint)!bVar13 * auVar38._12_4_);
      auVar73._0_4_ =
           (float)((uint)(bVar10 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar36._0_4_) *
           fVar1;
      auVar73._4_4_ = (float)((uint)bVar12 * auVar40._4_4_ | (uint)!bVar12 * auVar36._4_4_) * fVar2;
      auVar73._8_4_ = (float)((uint)bVar14 * auVar40._8_4_ | (uint)!bVar14 * auVar36._8_4_) * fVar3;
      auVar73._12_4_ =
           (float)((uint)bVar17 * auVar40._12_4_ | (uint)!bVar17 * auVar36._12_4_) * fVar4;
      auVar76._0_4_ =
           (float)((uint)(bVar10 & 1) * auVar52._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar45._0_4_) *
           auVar57._0_4_;
      auVar76._4_4_ =
           (float)((uint)bVar11 * auVar52._4_4_ | (uint)!bVar11 * auVar45._4_4_) * auVar57._4_4_;
      auVar76._8_4_ =
           (float)((uint)bVar15 * auVar52._8_4_ | (uint)!bVar15 * auVar45._8_4_) * auVar57._8_4_;
      auVar76._12_4_ =
           (float)((uint)bVar16 * auVar52._12_4_ | (uint)!bVar16 * auVar45._12_4_) * auVar57._12_4_;
      uVar30 = (ulong)(fVar1 < 0.0) * 0x10;
      stack[0].ptr.ptr = *(size_t *)&pAVar9[1].bounds.bounds0.lower.field_0;
      stack[0].dist = 0;
      auVar37 = vbroadcastss_avx512vl(auVar43);
      auVar78._4_4_ = auVar73._0_4_;
      auVar78._0_4_ = auVar73._0_4_;
      auVar78._8_4_ = auVar73._0_4_;
      auVar78._12_4_ = auVar73._0_4_;
      auVar80._8_4_ = 0x80000000;
      auVar80._0_8_ = 0x8000000080000000;
      auVar80._12_4_ = 0x80000000;
      auVar36 = vxorps_avx512vl(auVar78,auVar80);
      auVar40 = vshufps_avx512vl(auVar43,auVar43,0x55);
      auVar38 = vshufps_avx(auVar73,auVar73,0x55);
      auVar45 = vxorps_avx512vl(auVar38,auVar80);
      auVar56 = vshufps_avx512vl(auVar43,auVar43,0xaa);
      auVar38 = vshufps_avx(auVar73,auVar73,0xaa);
      auVar52 = vxorps_avx512vl(auVar38,auVar80);
      auVar54 = vbroadcastss_avx512vl(auVar57);
      auVar70._4_4_ = auVar76._0_4_;
      auVar70._0_4_ = auVar76._0_4_;
      auVar70._8_4_ = auVar76._0_4_;
      auVar70._12_4_ = auVar76._0_4_;
      auVar58 = vxorps_avx512vl(auVar70,auVar80);
      auVar59 = vshufps_avx512vl(auVar57,auVar57,0x55);
      auVar38 = vshufps_avx(auVar76,auVar76,0x55);
      auVar60 = vxorps_avx512vl(auVar38,auVar80);
      auVar61 = vshufps_avx512vl(auVar57,auVar57,0xaa);
      auVar38 = vshufps_avx(auVar76,auVar76,0xaa);
      auVar62 = vxorps_avx512vl(auVar38,auVar80);
      uVar83 = auVar49._0_4_;
      auVar68._4_4_ = uVar83;
      auVar68._0_4_ = uVar83;
      auVar68._8_4_ = uVar83;
      auVar68._12_4_ = uVar83;
      auVar38 = vshufps_avx(auVar49,auVar49,0xaa);
      auVar38 = vminps_avx512vl(auVar38,auVar68);
      auVar69._8_4_ = 0x7f800000;
      auVar69._0_8_ = 0x7f8000007f800000;
      auVar69._12_4_ = 0x7f800000;
      auVar49 = vpblendmd_avx512vl(auVar69,local_ff8);
      bVar11 = (bool)((byte)(uVar33 >> 1) & 1);
      bVar12 = (bool)((byte)(uVar33 >> 2) & 1);
      bVar13 = SUB81(uVar33 >> 3,0);
      local_f98 = (uint)(bVar31 & 1) * auVar49._0_4_ | (uint)!(bool)(bVar31 & 1) * 0x7f800000;
      uStack_f94 = (uint)bVar11 * auVar49._4_4_ | (uint)!bVar11 * 0x7f800000;
      uStack_f90 = (uint)bVar12 * auVar49._8_4_ | (uint)!bVar12 * 0x7f800000;
      uStack_f8c = (uint)bVar13 * auVar49._12_4_ | (uint)!bVar13 * 0x7f800000;
      pSVar29 = stack + 1;
LAB_0078f65c:
      auVar49 = vbroadcastss_avx512vl(auVar90._0_16_);
      while (pSVar29 != stack) {
        uVar8 = pSVar29[-1].dist;
        auVar71._4_4_ = uVar8;
        auVar71._0_4_ = uVar8;
        auVar71._8_4_ = uVar8;
        auVar71._12_4_ = uVar8;
        auVar72 = ZEXT1664(auVar71);
        pSVar29 = pSVar29 + -1;
        auVar66 = in_ZMM17._0_16_;
        uVar19 = vcmpps_avx512vl(auVar71,auVar66,1);
        if ((char)uVar19 != '\0') {
          sVar28 = (pSVar29->ptr).ptr;
          do {
            if ((sVar28 & 8) != 0) {
              uVar19 = vcmpps_avx512vl(auVar66,auVar72._0_16_,6);
              valid_leaf.v = (char)uVar19;
              if ((char)uVar19 != '\0') {
                local_fb8 = auVar90._0_16_;
                local_fa8 = auVar66;
                lVar24 = (ulong)((uint)sVar28 & 0xf) - 8;
                if (lVar24 != 0) {
                  prim = (Primitive *)(sVar28 & 0xfffffffffffffff0);
                  do {
                    InstanceIntersectorK<4>::intersect(&valid_leaf,&pre,ray,context,prim);
                    prim = prim + 1;
                    lVar24 = lVar24 + -1;
                  } while (lVar24 != 0);
                }
                auVar49 = *(undefined1 (*) [16])(ray + 0x80);
                uVar19 = vcmpps_avx512vl(auVar49,local_fa8,1);
                if ((valid_leaf.v & (byte)uVar19) == 0) {
                  auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                }
                else {
                  auVar65._0_4_ =
                       (uint)(valid_leaf.v & 1) * auVar49._0_4_ |
                       (uint)!(bool)(valid_leaf.v & 1) * local_fa8._0_4_;
                  bVar11 = (bool)(valid_leaf.v >> 1 & 1);
                  auVar65._4_4_ = (uint)bVar11 * auVar49._4_4_ | (uint)!bVar11 * local_fa8._4_4_;
                  bVar11 = (bool)(valid_leaf.v >> 2 & 1);
                  auVar65._8_4_ = (uint)bVar11 * auVar49._8_4_ | (uint)!bVar11 * local_fa8._8_4_;
                  bVar11 = (bool)(valid_leaf.v >> 3 & 1);
                  auVar65._12_4_ = (uint)bVar11 * auVar49._12_4_ | (uint)!bVar11 * local_fa8._12_4_;
                  auVar49 = vshufps_avx512vl(auVar65,auVar65,0xb1);
                  auVar66 = vmaxps_avx512vl(auVar49,auVar65);
                  auVar49 = vshufpd_avx(auVar66,auVar66,1);
                  local_fb8 = vmaxss_avx512f(auVar49,auVar66);
                  auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  local_fa8 = auVar65;
                }
                auVar90 = ZEXT1664(local_fb8);
                in_ZMM17 = ZEXT1664(local_fa8);
                auVar89 = ZEXT1664(auVar49);
              }
              goto LAB_0078f65c;
            }
            auVar63 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [16])(sVar28 + 0x20 + uVar30),auVar36,auVar37);
            auVar64 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [16])(sVar28 + 0x20 + uVar27),auVar45,auVar40);
            auVar63 = vpmaxsd_avx(auVar63,auVar64);
            auVar64 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [16])(sVar28 + 0x20 + uVar25),auVar52,auVar56);
            auVar64 = vpmaxsd_avx512vl(auVar64,auVar38);
            fmin.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           vpmaxsd_avx(auVar63,auVar64);
            auVar63 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [16])(sVar28 + 0x20 + (uVar30 ^ 0x10)),auVar58,
                                 auVar54);
            auVar64 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [16])(sVar28 + 0x20 + (uVar27 ^ 0x10)),auVar60,
                                 auVar59);
            auVar63 = vpminsd_avx(auVar63,auVar64);
            auVar64 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [16])(sVar28 + 0x20 + (uVar25 ^ 0x10)),auVar62,
                                 auVar61);
            auVar64 = vpminsd_avx(auVar64,auVar49);
            auVar63 = vpminsd_avx(auVar63,auVar64);
            uVar33 = vcmpps_avx512vl((undefined1  [16])fmin.field_0,auVar63,2);
            if ((char)uVar33 == '\0') {
              bVar11 = false;
              sVar23 = sVar28;
            }
            else {
              auVar72 = ZEXT1664(auVar89._0_16_);
              uVar26 = 0;
              sVar22 = 8;
              do {
                lVar24 = 0;
                for (uVar20 = uVar33; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000)
                {
                  lVar24 = lVar24 + 1;
                }
                uVar83 = *(undefined4 *)(sVar28 + 0x20 + lVar24 * 4);
                auVar74._4_4_ = uVar83;
                auVar74._0_4_ = uVar83;
                auVar74._8_4_ = uVar83;
                auVar74._12_4_ = uVar83;
                auVar39 = vfmadd132ps_fma(auVar74,auVar86,auVar18);
                uVar83 = *(undefined4 *)(sVar28 + 0x40 + lVar24 * 4);
                auVar77._4_4_ = uVar83;
                auVar77._0_4_ = uVar83;
                auVar77._8_4_ = uVar83;
                auVar77._12_4_ = uVar83;
                auVar41 = vfmadd132ps_fma(auVar77,auVar87,auVar34);
                uVar83 = *(undefined4 *)(sVar28 + 0x60 + lVar24 * 4);
                auVar79._4_4_ = uVar83;
                auVar79._0_4_ = uVar83;
                auVar79._8_4_ = uVar83;
                auVar79._12_4_ = uVar83;
                auVar42 = vfmadd132ps_fma(auVar79,auVar88,auVar35);
                uVar83 = *(undefined4 *)(sVar28 + 0x30 + lVar24 * 4);
                auVar81._4_4_ = uVar83;
                auVar81._0_4_ = uVar83;
                auVar81._8_4_ = uVar83;
                auVar81._12_4_ = uVar83;
                auVar43 = vfmadd132ps_fma(auVar81,auVar86,auVar18);
                uVar83 = *(undefined4 *)(sVar28 + 0x50 + lVar24 * 4);
                auVar82._4_4_ = uVar83;
                auVar82._0_4_ = uVar83;
                auVar82._8_4_ = uVar83;
                auVar82._12_4_ = uVar83;
                auVar44 = vfmadd132ps_fma(auVar82,auVar87,auVar34);
                uVar83 = *(undefined4 *)(sVar28 + 0x70 + lVar24 * 4);
                auVar84._4_4_ = uVar83;
                auVar84._0_4_ = uVar83;
                auVar84._8_4_ = uVar83;
                auVar84._12_4_ = uVar83;
                auVar46 = vfmadd132ps_fma(auVar84,auVar88,auVar35);
                auVar63 = vpminsd_avx(auVar39,auVar43);
                auVar64 = vpminsd_avx(auVar41,auVar44);
                auVar63 = vpmaxsd_avx(auVar63,auVar64);
                auVar64 = vpminsd_avx(auVar42,auVar46);
                auVar21._4_4_ = uStack_f94;
                auVar21._0_4_ = local_f98;
                auVar21._8_4_ = uStack_f90;
                auVar21._12_4_ = uStack_f8c;
                auVar64 = vpmaxsd_avx(auVar64,auVar21);
                auVar63 = vpmaxsd_avx(auVar63,auVar64);
                auVar64 = vpmaxsd_avx(auVar39,auVar43);
                auVar39 = vpmaxsd_avx(auVar41,auVar44);
                auVar39 = vpminsd_avx(auVar64,auVar39);
                auVar64 = vpmaxsd_avx(auVar42,auVar46);
                auVar64 = vpminsd_avx512vl(auVar64,auVar66);
                auVar64 = vpminsd_avx(auVar39,auVar64);
                uVar20 = vpcmpd_avx512vl(auVar63,auVar64,2);
                sVar23 = sVar22;
                if ((uVar20 & 0xf) != 0) {
                  uVar83 = *(undefined4 *)((long)&stack[-1].ptr.ptr + lVar24 * 4);
                  auVar75._4_4_ = uVar83;
                  auVar75._0_4_ = uVar83;
                  auVar75._8_4_ = uVar83;
                  auVar75._12_4_ = uVar83;
                  sVar23 = *(size_t *)(sVar28 + lVar24 * 8);
                  auVar63 = auVar72._0_16_;
                  uVar19 = vcmpps_avx512vl(auVar75,auVar63,1);
                  if ((char)uVar19 == '\0') {
                    (pSVar29->ptr).ptr = sVar23;
                    sVar23 = sVar22;
                  }
                  else {
                    if (sVar22 == 8) {
                      auVar72 = ZEXT1664(auVar75);
                      goto LAB_0078f81c;
                    }
                    (pSVar29->ptr).ptr = sVar22;
                    auVar72 = ZEXT1664(auVar75);
                    auVar75 = auVar63;
                  }
                  uVar26 = uVar26 + 1;
                  pSVar29->dist = auVar75._0_4_;
                  pSVar29 = pSVar29 + 1;
                }
LAB_0078f81c:
                uVar33 = uVar33 - 1 & uVar33;
                sVar22 = sVar23;
              } while (uVar33 != 0);
              if (sVar23 == 8) {
                bVar11 = false;
              }
              else {
                bVar11 = true;
                if (1 < uVar26) {
                  pSVar5 = pSVar29 + -2;
                  pSVar6 = pSVar29 + -1;
                  if (pSVar29[-2].dist < pSVar29[-1].dist) {
                    _valid_leaf = *pSVar5;
                    pSVar29[-2].dist = pSVar29[-1].dist;
                    (pSVar5->ptr).ptr = (pSVar6->ptr).ptr;
                    (pSVar6->ptr).ptr = _valid_leaf;
                    pSVar29[-1].dist = uStack_1190;
                  }
                  if (uVar26 != 2) {
                    pSVar7 = pSVar29 + -3;
                    if (pSVar29[-3].dist < pSVar29[-1].dist) {
                      _valid_leaf = *pSVar7;
                      pSVar29[-3].dist = pSVar29[-1].dist;
                      (pSVar7->ptr).ptr = (pSVar6->ptr).ptr;
                      (pSVar6->ptr).ptr = _valid_leaf;
                      pSVar29[-1].dist = uStack_1190;
                    }
                    if (pSVar29[-3].dist < pSVar29[-2].dist) {
                      _valid_leaf = *pSVar7;
                      pSVar29[-3].dist = pSVar29[-2].dist;
                      (pSVar7->ptr).ptr = (pSVar5->ptr).ptr;
                      (pSVar5->ptr).ptr = _valid_leaf;
                      pSVar29[-2].dist = uStack_1190;
                    }
                  }
                }
              }
            }
            sVar28 = sVar23;
          } while (bVar11);
        }
      }
    } while (uVar32 != 0);
  }
  return;
}

Assistant:

__forceinline vboolf4 operator ==(const vint4& a, const vint4& b) { return _mm_cmp_epi32_mask(a,b,_MM_CMPINT_EQ); }